

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_make_transformation_rotationf_x(matrix4 *m,float angle)

{
  double dVar1;
  double dVar2;
  float s;
  float c;
  float angle_local;
  matrix4 *m_local;
  
  dVar1 = cos((double)angle);
  dVar2 = sin((double)angle);
  matrix4_identity(m);
  (m->field_0).m[5] = (float)dVar1;
  (m->field_0).m[6] = (float)dVar2;
  (m->field_0).m[9] = -(float)dVar2;
  (m->field_0).m[10] = (float)dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationf_x(struct matrix4 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix4_identity(m);

	m->r11 = c;
	m->r12 = s;
	m->r21 = -s;
	m->r22 = c;

	return m;
}